

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

bool __thiscall benchmark::anon_unknown_1::TimerManager::Barrier(TimerManager *this,MutexLock *ml)

{
  int iVar1;
  bool bVar2;
  MutexLockImp *__lock;
  anon_class_16_2_8afad50c __p;
  anon_class_16_2_8afad50c cb;
  int phase_number_cp;
  MutexLock *local_20;
  MutexLock *ml_local;
  TimerManager *this_local;
  
  local_20 = ml;
  ml_local = (MutexLock *)this;
  if (this->entered_ < this->num_threads_) {
    internal::GetNullLogInstance();
    this->entered_ = this->entered_ + 1;
    bVar2 = this->num_threads_ <= this->entered_;
    if (bVar2) {
      this->phase_number_ = this->phase_number_ + 1;
      this->entered_ = 0;
    }
    else {
      iVar1 = this->phase_number_;
      __lock = MutexLock::native_handle(local_20);
      __p.phase_number_cp = iVar1;
      __p.this = this;
      __p._12_4_ = 0;
      std::condition_variable::
      wait<benchmark::(anonymous_namespace)::TimerManager::Barrier(benchmark::MutexLock&)::_lambda()_1_>
                (&this->phase_condition_,__lock,__p);
    }
    return bVar2;
  }
  internal::CheckHandler::CheckHandler
            ((CheckHandler *)&phase_number_cp,"(entered_) < (num_threads_)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
             ,"Barrier",0xe6);
  internal::CheckHandler::GetLog((CheckHandler *)&phase_number_cp);
  internal::CheckHandler::~CheckHandler((CheckHandler *)&phase_number_cp);
}

Assistant:

REQUIRES(lock_) {
    CHECK_LT(entered_, num_threads_);
    entered_++;
    if (entered_ < num_threads_) {
      // Wait for all threads to enter
      int phase_number_cp = phase_number_;
      auto cb = [this, phase_number_cp]() {
        return this->phase_number_ > phase_number_cp;
      };
      phase_condition_.wait(ml.native_handle(), cb);
      return false;  // I was not the last one
    } else {
      // Last thread has reached the barrier
      phase_number_++;
      entered_ = 0;
      return true;
    }
  }